

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-typed-test.cc
# Opt level: O2

char * __thiscall
testing::internal::TypedTestCasePState::VerifyRegisteredTestNames
          (TypedTestCasePState *this,char *file,int line,char *registered_tests)

{
  size_t *this_00;
  FILE *__stream;
  bool bVar1;
  size_type sVar2;
  Message *pMVar3;
  _Rb_tree_node_base *p_Var4;
  char *pcVar5;
  char *names;
  char *pcVar6;
  undefined1 local_a8 [8];
  set<testing::internal::String,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
  tests;
  undefined1 local_48 [8];
  String name;
  Message errors;
  
  *this = (TypedTestCasePState)0x1;
  pcVar6 = registered_tests + -1;
  do {
    pcVar5 = pcVar6 + 1;
    pcVar6 = pcVar6 + 1;
    bVar1 = IsSpace(*pcVar5);
  } while (bVar1);
  this_00 = &name.length_;
  Message::Message((Message *)this_00);
  tests._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&tests;
  tests._M_t._M_impl._0_4_ = 0;
  tests._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  tests._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  tests._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  pcVar5 = pcVar6;
  tests._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       tests._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  do {
    if (pcVar5 == (char *)0x0) {
      for (p_Var4 = *(_Rb_tree_node_base **)(this + 0x20);
          p_Var4 != (_Rb_tree_node_base *)(this + 0x10);
          p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
        String::String((String *)local_48,*(char **)(p_Var4 + 1));
        sVar2 = std::
                set<testing::internal::String,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
                ::count((set<testing::internal::String,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
                         *)local_a8,(String *)local_48);
        String::~String((String *)local_48);
        if (sVar2 == 0) {
          pMVar3 = Message::operator<<((Message *)&name.length_,
                                       (char (*) [25])"You forgot to list test ");
          pMVar3 = Message::operator<<(pMVar3,(char **)(p_Var4 + 1));
          Message::operator<<(pMVar3,(char (*) [3])0x138115);
        }
      }
      StringStreamToString((internal *)local_48,(stringstream *)name.length_);
      bVar1 = String::operator!=((String *)local_48,"");
      __stream = _stderr;
      if (!bVar1) {
        String::~String((String *)local_48);
        std::
        _Rb_tree<testing::internal::String,_testing::internal::String,_std::_Identity<testing::internal::String>,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
        ::~_Rb_tree((_Rb_tree<testing::internal::String,_testing::internal::String,_std::_Identity<testing::internal::String>,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
                     *)local_a8);
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&name.length_);
        return pcVar6;
      }
      FormatFileLocation((internal *)&tests._M_t._M_impl.super__Rb_tree_header._M_node_count,file,
                         line);
      fprintf(__stream,"%s %s",tests._M_t._M_impl.super__Rb_tree_header._M_node_count,local_48);
      String::~String((String *)&tests._M_t._M_impl.super__Rb_tree_header._M_node_count);
      fflush(_stderr);
      abort();
    }
    GetPrefixUntilComma((internal *)local_48,pcVar5);
    sVar2 = std::
            set<testing::internal::String,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
            ::count((set<testing::internal::String,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
                     *)local_a8,(String *)local_48);
    if (sVar2 == 0) {
      for (p_Var4 = *(_Rb_tree_node_base **)(this + 0x20);
          p_Var4 != (_Rb_tree_node_base *)(this + 0x10);
          p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
        bVar1 = String::operator==((String *)local_48,*(char **)(p_Var4 + 1));
        if (bVar1) {
          std::
          _Rb_tree<testing::internal::String,testing::internal::String,std::_Identity<testing::internal::String>,std::less<testing::internal::String>,std::allocator<testing::internal::String>>
          ::_M_insert_unique<testing::internal::String_const&>
                    ((_Rb_tree<testing::internal::String,testing::internal::String,std::_Identity<testing::internal::String>,std::less<testing::internal::String>,std::allocator<testing::internal::String>>
                      *)local_a8,(String *)local_48);
          goto LAB_0012d8ab;
        }
      }
      pMVar3 = Message::operator<<((Message *)this_00,(char (*) [15])"No test named ");
      pMVar3 = Message::operator<<(pMVar3,(String *)local_48);
      Message::operator<<(pMVar3,(char (*) [34])" can be found in this test case.\n");
    }
    else {
      pMVar3 = Message::operator<<((Message *)this_00,(char (*) [6])"Test ");
      pMVar3 = Message::operator<<(pMVar3,(String *)local_48);
      Message::operator<<(pMVar3,(char (*) [28])" is listed more than once.\n");
    }
LAB_0012d8ab:
    String::~String((String *)local_48);
    pcVar5 = SkipComma(pcVar5);
  } while( true );
}

Assistant:

const char* TypedTestCasePState::VerifyRegisteredTestNames(
    const char* file, int line, const char* registered_tests) {
  typedef ::std::set<const char*>::const_iterator DefinedTestIter;
  registered_ = true;

  // Skip initial whitespace in registered_tests since some
  // preprocessors prefix stringizied literals with whitespace.
  registered_tests = SkipSpaces(registered_tests);

  Message errors;
  ::std::set<String> tests;
  for (const char* names = registered_tests; names != NULL;
       names = SkipComma(names)) {
    const String name = GetPrefixUntilComma(names);
    if (tests.count(name) != 0) {
      errors << "Test " << name << " is listed more than once.\n";
      continue;
    }

    bool found = false;
    for (DefinedTestIter it = defined_test_names_.begin();
         it != defined_test_names_.end();
         ++it) {
      if (name == *it) {
        found = true;
        break;
      }
    }

    if (found) {
      tests.insert(name);
    } else {
      errors << "No test named " << name
             << " can be found in this test case.\n";
    }
  }

  for (DefinedTestIter it = defined_test_names_.begin();
       it != defined_test_names_.end();
       ++it) {
    if (tests.count(*it) == 0) {
      errors << "You forgot to list test " << *it << ".\n";
    }
  }

  const String& errors_str = errors.GetString();
  if (errors_str != "") {
    fprintf(stderr, "%s %s", FormatFileLocation(file, line).c_str(),
            errors_str.c_str());
    fflush(stderr);
    posix::Abort();
  }

  return registered_tests;
}